

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encoder_alloc.h
# Opt level: O2

void release_compound_type_rd_buffers(CompoundTypeRdBuffers *bufs)

{
  aom_free(bufs->pred0);
  aom_free(bufs->pred1);
  aom_free(bufs->residual1);
  aom_free(bufs->diff10);
  aom_free(bufs->tmp_best_mask_buf);
  bufs->residual1 = (int16_t *)0x0;
  bufs->diff10 = (int16_t *)0x0;
  bufs->pred0 = (uint8_t *)0x0;
  bufs->pred1 = (uint8_t *)0x0;
  bufs->tmp_best_mask_buf = (uint8_t *)0x0;
  return;
}

Assistant:

static inline void release_compound_type_rd_buffers(
    CompoundTypeRdBuffers *const bufs) {
  aom_free(bufs->pred0);
  aom_free(bufs->pred1);
  aom_free(bufs->residual1);
  aom_free(bufs->diff10);
  aom_free(bufs->tmp_best_mask_buf);
  av1_zero(*bufs);  // Set all pointers to NULL for safety.
}